

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O2

int __thiscall
opengv::relative_pose::OptimizeNonlinearFunctor1::operator()
          (OptimizeNonlinearFunctor1 *this,VectorXd *x,VectorXd *fvec)

{
  Indices *pIVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  Scalar SVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  bearingVector_t f1;
  bearingVector_t reprojection1;
  bearingVector_t reprojection2;
  transformation_t inverseSolution;
  translation_t directTranslation;
  translation_t cam2Offset;
  translation_t cam1Offset;
  translation_t translation;
  Matrix<double,_4,_1,_0,_4,_1> p_hom;
  bearingVector_t f2;
  cayley_t cayley;
  rotation_t cam2Rotation;
  rotation_t cam1Rotation;
  rotation_t rotation;
  rotation_t directRotation;
  undefined1 local_350 [16];
  DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>,_0>_>
  *local_340;
  variable_if_dynamic<long,__1> local_338;
  variable_if_dynamic<long,__1> vStack_330;
  Index local_328;
  Matrix<double,_3,_1,_0,_3,_1> *local_318;
  Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
  *local_310;
  double *local_308;
  undefined1 local_300 [16];
  DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>,_0>_>
  *local_2f0;
  variable_if_dynamic<long,__1> local_2e8;
  variable_if_dynamic<long,__1> local_2e0;
  Index local_2d8;
  VectorXd *local_2d0;
  double local_2c8;
  double local_2c0;
  double dStack_2b8;
  double local_2b0;
  double *local_2a0;
  rotation_t *local_298;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *local_290;
  undefined1 *local_288;
  rotation_t *local_278;
  undefined1 *local_270;
  undefined1 local_258 [24];
  Matrix<double,_3,_1,_0,_3,_1> local_240;
  undefined1 local_228 [24];
  undefined1 local_210 [24];
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_1f8 [24];
  undefined1 local_1e0 [104];
  VectorXd local_178 [4];
  double local_130 [9];
  rotation_t local_e8;
  PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> local_a0 [112];
  
  local_2a0 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  local_278 = (rotation_t *)
              (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  local_288 = (undefined1 *)0x0;
  local_2d0 = fvec;
  local_290 = (PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)x;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>>
            (local_1f8,
             (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_> *)
             &local_2a0);
  local_278 = (rotation_t *)
              (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  local_2a0 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data +
              3;
  local_288 = (undefined1 *)0x3;
  local_290 = (PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)x;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)(local_1e0 + 0x50),
             (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_> *)
             &local_2a0);
  math::cayley2rot(&local_e8,(cayley_t *)(local_1e0 + 0x50));
  lVar5 = 0;
  uVar3 = 0;
  local_1e0._24_8_ = 1.0;
  while( true ) {
    pIVar1 = this->_indices;
    if (pIVar1->_numberCorrespondences <= uVar3) break;
    iVar6 = (int)uVar3;
    lVar4 = lVar5 >> 0x1e;
    iVar2 = iVar6;
    if (pIVar1->_useIndices != false) {
      iVar2 = *(int *)((long)(pIVar1->_indices->super__Vector_base<int,_std::allocator<int>_>).
                             _M_impl.super__Vector_impl_data._M_start + lVar4);
    }
    (*this->_adapter->_vptr_RelativeAdapterBase[5])(local_210,this->_adapter,(long)iVar2);
    iVar2 = iVar6;
    if (this->_indices->_useIndices != false) {
      iVar2 = *(int *)((long)(this->_indices->_indices->
                             super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start + lVar4);
    }
    (*this->_adapter->_vptr_RelativeAdapterBase[6])(local_130,this->_adapter,(long)iVar2);
    iVar2 = iVar6;
    if (this->_indices->_useIndices != false) {
      iVar2 = *(int *)((long)(this->_indices->_indices->
                             super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start + lVar4);
    }
    (*this->_adapter->_vptr_RelativeAdapterBase[7])(local_228,this->_adapter,(long)iVar2);
    iVar2 = iVar6;
    if (this->_indices->_useIndices != false) {
      iVar2 = *(int *)((long)(this->_indices->_indices->
                             super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start + lVar4);
    }
    (*this->_adapter->_vptr_RelativeAdapterBase[8])(local_178,this->_adapter,(long)iVar2);
    local_290 = local_1f8;
    local_288 = local_210;
    local_2a0 = local_130;
    local_278 = &local_e8;
    local_270 = local_228;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>const>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_240,
               (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>,_0>_>
                *)&local_2a0);
    local_290 = (PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_178;
    local_2a0 = local_130;
    local_298 = &local_e8;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
    _set_noalias<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,3,0,3,3>,0>>
              (local_a0,(DenseBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
                         *)&local_2a0);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>>
              (&this->_adapter->_t12,&local_240);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>>
              (&this->_adapter->_R12,(Matrix<double,_3,_3,_0,_3,_3> *)local_a0);
    local_338.m_value = 0;
    vStack_330.m_value = 0;
    local_328 = 3;
    local_350._0_8_ =
         (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>,_0>_>
          *)&local_2a0;
    local_340 = (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>,_0>_>
                 *)&local_2a0;
    local_300._0_8_ = local_a0;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,3,false>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>
              ((Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false> *)local_350,
               (Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_300);
    local_300._0_8_ = local_258;
    local_318 = &local_240;
    local_2e8.m_value = 0;
    local_338.m_value = 0;
    vStack_330.m_value = 0;
    local_328 = 3;
    local_2e0.m_value = 3;
    local_2d8 = 3;
    local_350._0_8_ =
         (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>,_0>_>
          *)&local_2a0;
    local_340 = (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>,_0>_>
                 *)&local_2a0;
    local_2f0 = (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>,_0>_>
                 *)&local_2a0;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,1,true>,Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,3,false>const>,Eigen::Matrix<double,3,1,0,3,1>,0>>
              ((Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true> *)local_300,
               (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
                *)local_350);
    iVar2 = iVar6;
    if (this->_indices->_useIndices != false) {
      iVar2 = *(int *)((long)(this->_indices->_indices->
                             super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start + lVar4);
    }
    triangulation::triangulate2((point_t *)local_300,this->_adapter,(long)iVar2);
    local_338.m_value = 0;
    local_328 = 4;
    local_350._0_8_ = (XprTypeNested)local_1e0;
    local_340 = (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>,_0>_>
                 *)local_1e0;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,3,1,false>,Eigen::Matrix<double,3,1,0,3,1>>
              ((Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_3,_1,_false> *)local_350,
               (Matrix<double,_3,_1,_0,_3,_1> *)local_300);
    local_338.m_value = 0;
    local_328 = 4;
    local_350._0_8_ = (XprTypeNested)local_1e0;
    local_340 = (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>,_0>_>
                 *)local_1e0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,3,1,false>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_300,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_3,_1,_false>_> *)
               local_350);
    local_350._0_8_ = &local_2a0;
    local_350._8_8_ = (XprTypeNested)local_1e0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::Product<Eigen::Matrix<double,3,4,0,3,4>,Eigen::Matrix<double,4,1,0,4,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_2c0,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>_>
                *)local_350);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = (double)local_2f0 * (double)local_2f0 +
                   (double)local_300._0_8_ * (double)local_300._0_8_ +
                   (double)local_300._8_8_ * (double)local_300._8_8_;
    auVar8 = vsqrtsd_avx(auVar8,auVar8);
    local_340 = auVar8._0_8_;
    local_350._0_8_ = (PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_300;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)local_300,
               (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)local_350);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = local_2b0 * local_2b0 + local_2c0 * local_2c0 + dStack_2b8 * dStack_2b8;
    auVar8 = vsqrtsd_avx(auVar9,auVar9);
    local_340 = auVar8._0_8_;
    local_350._0_8_ = (PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_2c0;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)&local_2c0,
               (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)local_350);
    iVar2 = iVar6;
    if (this->_indices->_useIndices != false) {
      iVar2 = *(int *)((long)(this->_indices->_indices->
                             super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start + lVar4);
    }
    (*this->_adapter->_vptr_RelativeAdapterBase[2])
              ((Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
                *)local_350,this->_adapter,(long)iVar2);
    if (this->_indices->_useIndices != false) {
      iVar6 = *(int *)((long)(this->_indices->_indices->
                             super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start + lVar4);
    }
    (*this->_adapter->_vptr_RelativeAdapterBase[3])(local_1e0 + 0x38,this->_adapter,(long)iVar6);
    local_308 = (double *)local_300;
    local_310 = (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
                 *)local_350;
    SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                      ((dense_product_base *)&local_310);
    local_308 = &local_2c0;
    local_2c8 = 1.0 - SVar7;
    local_310 = (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
                 *)(local_1e0 + 0x38);
    SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                      ((dense_product_base *)&local_310);
    lVar5 = lVar5 + 0x100000000;
    (local_2d0->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
    [uVar3] = (1.0 - SVar7) + local_2c8;
    uVar3 = uVar3 + 1;
  }
  return 0;
}

Assistant:

int operator()(const VectorXd &x, VectorXd &fvec) const
  {
    assert( x.size() == 6 );
    assert( (unsigned int) fvec.size() == _indices.size());

    //compute the current position
    translation_t translation = x.block<3,1>(0,0);
    cayley_t cayley = x.block<3,1>(3,0);
    rotation_t rotation = math::cayley2rot(cayley);

    Eigen::Matrix<double,4,1> p_hom;
    p_hom[3] = 1.0;

    for( size_t i = 0; i < _indices.size(); i++ )
    {
      translation_t cam1Offset = _adapter.getCamOffset1(_indices[i]);
      rotation_t cam1Rotation = _adapter.getCamRotation1(_indices[i]);
      translation_t cam2Offset = _adapter.getCamOffset2(_indices[i]);
      rotation_t cam2Rotation = _adapter.getCamRotation2(_indices[i]);

      translation_t directTranslation =
          cam1Rotation.transpose() *
          ((translation - cam1Offset) + rotation * cam2Offset);
      rotation_t directRotation =
          cam1Rotation.transpose() * rotation * cam2Rotation;

      _adapter.sett12(directTranslation);
      _adapter.setR12(directRotation);

      transformation_t inverseSolution;
      inverseSolution.block<3,3>(0,0) = directRotation.transpose();
      inverseSolution.col(3) =
          -inverseSolution.block<3,3>(0,0)*directTranslation;

      p_hom.block<3,1>(0,0) =
          opengv::triangulation::triangulate2(_adapter,_indices[i]);
      bearingVector_t reprojection1 = p_hom.block<3,1>(0,0);
      bearingVector_t reprojection2 = inverseSolution * p_hom;
      reprojection1 = reprojection1 / reprojection1.norm();
      reprojection2 = reprojection2 / reprojection2.norm();
      bearingVector_t f1 = _adapter.getBearingVector1(_indices[i]);
      bearingVector_t f2 = _adapter.getBearingVector2(_indices[i]);

      //bearing-vector based outlier criterium (select threshold accordingly):
      //1-(f1'*f2) = 1-cos(alpha) \in [0:2]
      double reprojError1 = 1.0 - (f1.transpose() * reprojection1);
      double reprojError2 = 1.0 - (f2.transpose() * reprojection2);
      double factor = 1.0;
      fvec[i] = factor*(reprojError1 + reprojError2);
    }

    return 0;
  }